

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * soul::Value::createStringLiteral(Value *__return_storage_ptr__,Handle h)

{
  PackedData PStack_48;
  Type local_30;
  
  local_30.category = stringLiteral;
  local_30._1_8_ = 0;
  local_30._9_7_ = 0;
  local_30.structure.object._0_1_ = 0;
  local_30.structure.object._1_7_ = 0;
  Value(__return_storage_ptr__,&local_30);
  RefCountedPtr<soul::Structure>::decIfNotNull
            ((Structure *)CONCAT71(local_30.structure.object._1_7_,local_30.structure.object._0_1_))
  ;
  getData(&PStack_48,__return_storage_ptr__);
  if (PStack_48.size == 4) {
    *(uint32_t *)PStack_48.data = h.handle;
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","setAs",0x161);
}

Assistant:

Value Value::createStringLiteral (StringDictionary::Handle h)
{
    Value v (Type::createStringLiteral());
    v.getData().setAs (h);
    return v;
}